

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O3

void sha512_update_block(void *vctx,uint8_t *inp)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong *local_108;
  ulong auStack_b8 [17];
  
  uVar1 = *vctx;
  uVar2 = *(ulong *)((long)vctx + 8);
  uVar3 = *(ulong *)((long)vctx + 0x10);
  uVar4 = *(ulong *)((long)vctx + 0x18);
  uVar5 = *(ulong *)((long)vctx + 0x20);
  uVar6 = *(ulong *)((long)vctx + 0x28);
  uVar7 = *(ulong *)((long)vctx + 0x30);
  uVar8 = *(ulong *)((long)vctx + 0x38);
  uVar18 = uVar2;
  uVar10 = uVar3;
  uVar13 = uVar5;
  uVar14 = uVar4;
  uVar15 = 0;
  uVar19 = uVar1;
  uVar12 = uVar6;
  uVar21 = uVar8;
  uVar20 = uVar7;
  local_108 = (ulong *)inp;
  do {
    uVar23 = uVar20;
    uVar20 = uVar12;
    uVar17 = uVar19;
    uVar12 = uVar13;
    uVar11 = uVar10;
    uVar10 = uVar18;
    if (uVar15 < 0x10) {
      uVar18 = *local_108;
      uVar18 = uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 |
               (uVar18 & 0xff0000000000) >> 0x18 | (uVar18 & 0xff00000000) >> 8 |
               (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 | (uVar18 & 0xff00) << 0x28
               | uVar18 << 0x38;
      auStack_b8[uVar15] = uVar18;
      local_108 = local_108 + 1;
    }
    else {
      uVar9 = (uint)uVar15;
      uVar18 = auStack_b8[uVar9 + 0xe & 0xf];
      uVar13 = auStack_b8[uVar9 + 1 & 0xf];
      uVar18 = (uVar18 >> 6 ^ (uVar18 << 3 | uVar18 >> 0x3d) ^ (uVar18 << 0x2d | uVar18 >> 0x13)) +
               auStack_b8[uVar9 + 9 & 0xf] + auStack_b8[uVar9 & 0xf] +
               (uVar13 >> 7 ^
               (uVar13 << 0x38 | uVar13 >> 8) ^ (uVar13 >> 1 | (ulong)((uVar13 & 1) != 0) << 0x3f));
      auStack_b8[uVar9 & 0xf] = uVar18;
    }
    uVar16 = uVar15 + 1;
    lVar22 = uVar21 + ((uVar20 ^ uVar23) & uVar12 ^ uVar23) +
             ((uVar12 << 0x17 | uVar12 >> 0x29) ^
             (uVar12 << 0x2e | uVar12 >> 0x12) ^ (uVar12 << 0x32 | uVar12 >> 0xe)) + uVar18 +
             K[uVar15];
    uVar13 = uVar14 + lVar22;
    uVar19 = (uVar11 & uVar10 ^ (uVar11 ^ uVar10) & uVar17) +
             ((uVar17 << 0x19 | uVar17 >> 0x27) ^
             (uVar17 << 0x1e | uVar17 >> 0x22) ^ (uVar17 << 0x24 | uVar17 >> 0x1c)) + lVar22;
    uVar18 = uVar17;
    uVar14 = uVar11;
    uVar15 = uVar16;
    uVar21 = uVar23;
  } while (uVar16 != 0x50);
  *(ulong *)vctx = uVar19 + uVar1;
  *(ulong *)((long)vctx + 8) = uVar17 + uVar2;
  *(ulong *)((long)vctx + 0x10) = uVar10 + uVar3;
  *(ulong *)((long)vctx + 0x18) = uVar11 + uVar4;
  *(ulong *)((long)vctx + 0x20) = uVar13 + uVar5;
  *(ulong *)((long)vctx + 0x28) = uVar12 + uVar6;
  *(ulong *)((long)vctx + 0x30) = uVar20 + uVar7;
  *(ulong *)((long)vctx + 0x38) = uVar23 + uVar8;
  *(int *)((long)vctx + 0xc0) = *(int *)((long)vctx + 0xc0) + 1;
  return;
}

Assistant:

static void sha512_update_block(void *vctx, const uint8_t *inp)
{
  cf_sha512_context *ctx = vctx;

  uint64_t W[16];

  uint64_t a = ctx->H[0],
           b = ctx->H[1],
           c = ctx->H[2],
           d = ctx->H[3],
           e = ctx->H[4],
           f = ctx->H[5],
           g = ctx->H[6],
           h = ctx->H[7],
           Wt;

  size_t t;
  for (t = 0; t < 80; t++)
  {
    if (t < 16)
    {
      W[t] = Wt = read64_be(inp);
      inp += 8;
    } else {
      Wt = SSIG1(W[(t - 2) % 16]) +
           W[(t - 7) % 16] +
           SSIG0(W[(t - 15) % 16]) +
           W[(t - 16) % 16];
      W[t % 16] = Wt;
    }

    uint64_t T1 = h + BSIG1(e) + CH(e, f, g) + K[t] + Wt;
    uint64_t T2 = BSIG0(a) + MAJ(a, b, c);
    h = g;
    g = f;
    f = e;
    e = d + T1;
    d = c;
    c = b;
    b = a;
    a = T1 + T2;
  }

  ctx->H[0] += a;
  ctx->H[1] += b;
  ctx->H[2] += c;
  ctx->H[3] += d;
  ctx->H[4] += e;
  ctx->H[5] += f;
  ctx->H[6] += g;
  ctx->H[7] += h;

  ctx->blocks++;
}